

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O1

int Bdc_DecomposeStepMux(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  uint nVars;
  int iVar1;
  long lVar2;
  long lVar3;
  uint iVar;
  timespec ts;
  timespec local_40;
  
  if (p->pPars->fVerbose == 0) {
    lVar2 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar2 = 1;
    }
    else {
      lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
  }
  nVars = p->nVars;
  if (0 < (int)nVars) {
    iVar = 0;
    do {
      if ((pIsf->uSupp >> (iVar & 0x1f) & 1) != 0) {
        Kit_TruthCofactor0New(pIsfL->puOn,pIsf->puOn,nVars,iVar);
        Kit_TruthCofactor0New(pIsfL->puOff,pIsf->puOff,p->nVars,iVar);
        Kit_TruthCofactor1New(pIsfR->puOn,pIsf->puOn,p->nVars,iVar);
        Kit_TruthCofactor1New(pIsfR->puOff,pIsf->puOff,p->nVars,iVar);
        Kit_TruthSupport(pIsfL->puOn,p->nVars);
        Kit_TruthSupport(pIsfL->puOff,p->nVars);
        Kit_TruthSupport(pIsfR->puOn,p->nVars);
        Kit_TruthSupport(pIsfR->puOff,p->nVars);
        goto LAB_005271b1;
      }
      iVar = iVar + 1;
    } while (nVars != iVar);
  }
  iVar = 0xffffffff;
LAB_005271b1:
  if (-1 < (int)iVar) {
    Kit_TruthCofactor0New(pIsfL->puOn,pIsf->puOn,p->nVars,iVar);
    Kit_TruthCofactor0New(pIsfL->puOff,pIsf->puOff,p->nVars,iVar);
    Kit_TruthCofactor1New(pIsfR->puOn,pIsf->puOn,p->nVars,iVar);
    Kit_TruthCofactor1New(pIsfR->puOff,pIsf->puOff,p->nVars,iVar);
    Bdc_SuppMinimize(p,pIsfL);
    Bdc_SuppMinimize(p,pIsfR);
  }
  if (p->pPars->fVerbose != 0) {
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeMuxes = p->timeMuxes + lVar3 + lVar2;
  }
  return iVar;
}

Assistant:

int Bdc_DecomposeStepMux( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    int Var, VarMin, nSuppMin, nSuppCur;
    unsigned uSupp0, uSupp1;
    abctime clk = 0; // Suppress "might be used uninitialized"
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    VarMin = -1;
    nSuppMin = 1000;
	for ( Var = 0; Var < p->nVars; Var++ )
    {
        if ( (pIsf->uSupp & (1 << Var)) == 0 )
            continue;
        Kit_TruthCofactor0New( pIsfL->puOn,  pIsf->puOn,  p->nVars, Var );
        Kit_TruthCofactor0New( pIsfL->puOff, pIsf->puOff, p->nVars, Var );
        Kit_TruthCofactor1New( pIsfR->puOn,  pIsf->puOn,  p->nVars, Var );
        Kit_TruthCofactor1New( pIsfR->puOff, pIsf->puOff, p->nVars, Var );
        uSupp0 = Kit_TruthSupport( pIsfL->puOn, p->nVars ) & Kit_TruthSupport( pIsfL->puOff, p->nVars );
        uSupp1 = Kit_TruthSupport( pIsfR->puOn, p->nVars ) & Kit_TruthSupport( pIsfR->puOff, p->nVars );
        nSuppCur = Kit_WordCountOnes(uSupp0) + Kit_WordCountOnes(uSupp1);  
        if ( nSuppMin > nSuppCur )
        {
            nSuppMin = nSuppCur;
            VarMin = Var;
            break;
        }
    }
    if ( VarMin >= 0 )
    {
        Kit_TruthCofactor0New( pIsfL->puOn,  pIsf->puOn,  p->nVars, VarMin );
        Kit_TruthCofactor0New( pIsfL->puOff, pIsf->puOff, p->nVars, VarMin );
        Kit_TruthCofactor1New( pIsfR->puOn,  pIsf->puOn,  p->nVars, VarMin );
        Kit_TruthCofactor1New( pIsfR->puOff, pIsf->puOff, p->nVars, VarMin );
        Bdc_SuppMinimize( p, pIsfL );
        Bdc_SuppMinimize( p, pIsfR );
    }
    if ( p->pPars->fVerbose )
        p->timeMuxes += Abc_Clock() - clk;
    return VarMin;
}